

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfdcapi_elements_transaction_CfdAddPegoutTest_Test::TestBody
          (cfdcapi_elements_transaction_CfdAddPegoutTest_Test *this)

{
  bool bVar1;
  char *in_R9;
  void **create_handle_00;
  char *pcVar2;
  AssertHelper local_80;
  int ret;
  AssertionResult gtest_ar_;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  void *create_handle;
  char *tx_string;
  void *handle;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_string,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7f2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_string,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_string);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&create_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7f3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&create_handle,(Message *)&tx_string)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&create_handle);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                      local_48._M_allocated_capacity + 1);
    }
    if (tx_string != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_string != (char *)0x0)) {
        (**(code **)(*(long *)tx_string + 8))();
      }
      tx_string = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  tx_string = (char *)0x0;
  create_handle_00 = &create_handle;
  create_handle = (void *)0x0;
  ret = CfdInitializeTransaction(handle,10,2,0,(char *)0x0,create_handle_00);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7fa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = create_handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (create_handle == (void *)0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"(NULL == create_handle)","true","false",(char *)create_handle_00)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7fb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                      local_48._M_allocated_capacity + 1);
    }
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (ret == 0) {
    ret = CfdAddTransactionInput
                    (handle,create_handle,
                     "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",0,0xfffffffd
                    );
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x800,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    pcVar2 = "";
    ret = CfdAddTransactionOutput
                    (handle,create_handle,0xbefe33cc397c,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA","",
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x809,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    ret = CfdAddTxPegoutOutput
                    (handle,create_handle,
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",1000000000,2
                     ,0xb,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
                     "0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",
                     "cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL",
                     "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
                     ,0,
                     "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"
                     ,(char **)&gtest_ar_);
    local_80.data_ = local_80.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x819,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
        local_80.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"","mainchain_address"
                 ,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",(char *)gtest_ar_._0_8_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x81b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_80.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
          local_80.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
    }
  }
  if (ret == 0) {
    ret = CfdAddTransactionOutput
                    (handle,create_handle,0x1c84,(char *)0x0,(char *)0x0,
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x826,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    ret = CfdCreateHandle((void **)&gtest_ar_);
    if (ret == 0) {
      ret = CfdHasPegoutConfidentialTxOut((void *)gtest_ar_._0_8_,create_handle,0);
      local_80.data_._0_4_ = 8;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdNotFoundError","ret",(CfdErrorCode *)&local_80,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x82e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_80.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
          local_80.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeHandle((void *)gtest_ar_._0_8_);
    }
    ret = CfdHasPegoutConfidentialTxOut(handle,create_handle,1);
    local_80.data_ = local_80.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x833,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
        local_80.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    ret = CfdGetPegoutMainchainAddress(handle,create_handle,1,2,(char **)&gtest_ar_);
    local_80.data_ = local_80.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x83a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
        local_80.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"","addr",
                 "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",(char *)gtest_ar_._0_8_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x83c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_80.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
          local_80.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
    }
  }
  if (ret == 0) {
    ret = CfdFinalizeTransaction(handle,create_handle,&tx_string);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x843,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
                 ,"tx_string",
                 "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
                 ,tx_string);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x845,pcVar2);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(tx_string);
    }
  }
  CfdFreeTransactionHandle(handle,create_handle);
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    ret = CfdGetLastErrorMessage(handle,(char **)&gtest_ar_);
    local_80.data_ = local_80.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x850,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
        local_80.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)gtest_ar_._0_8_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x851,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
        local_80.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
  }
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x857,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdAddPegoutTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  int64_t satoshi;

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(handle, kCfdNetworkLiquidv1, 2, 0, nullptr, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));
  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(
      handle, create_handle, "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3", 0,
      4294967293U);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 209998999992700;
    ret = CfdAddTransactionOutput(
      handle, create_handle, satoshi,
      "XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", "",
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 1000000000;
    char* mainchain_address = nullptr;
    ret = CfdAddTxPegoutOutput(
      handle, create_handle,
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225", satoshi,
      kCfdNetworkRegtest, kCfdNetworkElementsRegtest,
      "0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
      "0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",
      "cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
      0, "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",
      &mainchain_address);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo", mainchain_address);
      CfdFreeStringBuffer(mainchain_address);
    }
  }

  if (ret == kCfdSuccess) {
    satoshi = 7300;
    ret = CfdAddTransactionOutput(
      handle, create_handle, satoshi,
      nullptr, nullptr,
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    void* err_handle = NULL;
    ret = CfdCreateHandle(&err_handle);
    if (ret == kCfdSuccess) {
      ret = CfdHasPegoutConfidentialTxOut(err_handle, create_handle, 0);
      EXPECT_EQ(kCfdNotFoundError, ret);
      CfdFreeHandle(err_handle);
    }

    ret = CfdHasPegoutConfidentialTxOut(handle, create_handle, 1);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    char* addr = nullptr;
    ret = CfdGetPegoutMainchainAddress(
      handle, create_handle, 1, kCfdNetworkRegtest, &addr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo", addr);
      CfdFreeStringBuffer(addr);
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeTransaction(handle, create_handle, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000", tx_string);
      CfdFreeStringBuffer(tx_string);
    }
  }

  CfdFreeTransactionHandle(handle, create_handle);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}